

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.hpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::
GetId<ot::commissioner::persistent_storage::BorderRouter,ot::commissioner::persistent_storage::BorderRouterId>
          (PersistentStorageJson *this,BorderRouterId *aId,BorderRouter *aRet,string *aArrName)

{
  bool bVar1;
  reference pvVar2;
  reference this_00;
  json *this_01;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  itValue;
  BorderRouterId *local_260;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_258;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_238;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_218;
  undefined1 local_1f8 [16];
  BorderAgent BStack_1e8;
  iterator local_70;
  iterator local_50;
  
  this_01 = &this->mCache;
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](this_01,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin(&local_50,pvVar2);
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](this_01,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end(&local_70,pvVar2);
  local_258.m_it.primitive_iterator.m_it = local_50.m_it.primitive_iterator.m_it;
  local_258.m_it.object_iterator._M_node = local_50.m_it.object_iterator._M_node;
  local_258.m_it.array_iterator._M_current = local_50.m_it.array_iterator._M_current;
  local_218.m_it.primitive_iterator.m_it = local_70.m_it.primitive_iterator.m_it;
  local_218.m_it.object_iterator._M_node = local_70.m_it.object_iterator._M_node;
  local_218.m_it.array_iterator._M_current = local_70.m_it.array_iterator._M_current;
  local_258.m_object = local_50.m_object;
  local_218.m_object = local_70.m_object;
  local_260 = aId;
  bVar1 = nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_258,&local_218);
  if (!bVar1) {
    do {
      local_1f8._0_8_ = local_258.m_object;
      BStack_1e8.mAddr._M_dataplus._M_p = (pointer)local_258.m_it.primitive_iterator.m_it;
      local_1f8._8_8_ = local_258.m_it.object_iterator._M_node;
      BStack_1e8._vptr_BorderAgent = (_func_int **)local_258.m_it.array_iterator._M_current;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<ot::commissioner::persistent_storage::PersistentStorageJson::GetId<ot::commissioner::persistent_storage::BorderRouter,ot::commissioner::persistent_storage::BorderRouterId>(ot::commissioner::persistent_storage::BorderRouterId_const&,ot::commissioner::persistent_storage::BorderRouter&,std::__cxx11::string)::{lambda(ot::commissioner::persistent_storage::BorderRouter_const&)#1}>
              ::operator()((_Iter_pred<ot::commissioner::persistent_storage::PersistentStorageJson::GetId<ot::commissioner::persistent_storage::BorderRouter,ot::commissioner::persistent_storage::BorderRouterId>(ot::commissioner::persistent_storage::BorderRouterId_const&,ot::commissioner::persistent_storage::BorderRouter&,std::__cxx11::string)::_lambda(ot::commissioner::persistent_storage::BorderRouter_const&)_1_>
                            *)&local_260,
                           (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)local_1f8);
      if (bVar1) break;
      nlohmann::detail::
      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++(&local_258);
      bVar1 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==(&local_258,&local_218);
    } while (!bVar1);
  }
  local_238.m_object = local_258.m_object;
  local_238.m_it.object_iterator._M_node = local_258.m_it.object_iterator._M_node;
  local_238.m_it.array_iterator._M_current = local_258.m_it.array_iterator._M_current;
  local_238.m_it.primitive_iterator.m_it = local_258.m_it.primitive_iterator.m_it;
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](this_01,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((iterator *)local_1f8,pvVar2);
  bVar1 = nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_238,(iterator *)local_1f8);
  if (!bVar1) {
    this_00 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator*(&local_238);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<ot::commissioner::persistent_storage::BorderRouter,_ot::commissioner::persistent_storage::BorderRouter,_0>
              ((BorderRouter *)local_1f8,this_00);
    aRet->mId = (BorderRouterId)local_1f8._8_4_;
    aRet->mNetworkId = (NetworkId)local_1f8._12_4_;
    std::__cxx11::string::_M_assign((string *)&(aRet->mAgent).mAddr);
    (aRet->mAgent).mPort = BStack_1e8.mPort;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(aRet->mAgent).mDiscriminator,&BStack_1e8.mDiscriminator);
    std::__cxx11::string::_M_assign((string *)&(aRet->mAgent).mThreadVersion);
    *(undefined2 *)&(aRet->mAgent).mState = BStack_1e8.mState._0_2_;
    std::__cxx11::string::_M_assign((string *)&(aRet->mAgent).mNetworkName);
    (aRet->mAgent).mExtendedPanId = BStack_1e8.mExtendedPanId;
    std::__cxx11::string::_M_assign((string *)&(aRet->mAgent).mVendorName);
    std::__cxx11::string::_M_assign((string *)&(aRet->mAgent).mModelName);
    (aRet->mAgent).mPartitionId = BStack_1e8.mPartitionId;
    (aRet->mAgent).mActiveTimestamp = BStack_1e8.mActiveTimestamp;
    std::__cxx11::string::_M_assign((string *)&(aRet->mAgent).mVendorData);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(aRet->mAgent).mVendorOui,&BStack_1e8.mVendorOui);
    std::__cxx11::string::_M_assign((string *)&(aRet->mAgent).mDomainName);
    (aRet->mAgent).mBbrSeqNumber = BStack_1e8.mBbrSeqNumber;
    (aRet->mAgent).field_0x141 = BStack_1e8._321_1_;
    (aRet->mAgent).mBbrPort = BStack_1e8.mBbrPort;
    std::__cxx11::string::_M_assign((string *)&(aRet->mAgent).mServiceName);
    (aRet->mAgent).mPresentFlags = BStack_1e8.mPresentFlags;
    (aRet->mAgent).mUpdateTimestamp.mTime = BStack_1e8.mUpdateTimestamp.mTime;
    local_1f8._0_8_ = &PTR__BorderRouter_00291de0;
    BorderAgent::~BorderAgent(&BStack_1e8);
  }
  return bVar1;
}

Assistant:

Status GetId(I const &aId, V &aRet, std::string aArrName)
    {
        auto itValue = std::find_if(std::begin(mCache[aArrName]), std::end(mCache[aArrName]),
                                    [&aId](V const &el) { return el.mId.mId == aId.mId; });
        if (itValue == std::end(mCache[aArrName]))
        {
            return Status::kNotFound;
        }

        aRet = *itValue;

        return Status::kSuccess;
    }